

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error __thiscall asmjit::Logger::logBinary(Logger *this,void *data,size_t size)

{
  byte bVar1;
  char *pcVar2;
  Error EVar3;
  unsigned_long *puVar4;
  unsigned_long in_RDX;
  byte *in_RSI;
  long *in_RDI;
  Error _err;
  uint32_t c;
  char *p;
  uint32_t n;
  char buffer [128];
  size_t i;
  uint8_t *s;
  char *local_e0;
  unsigned_long local_d8;
  int local_cc;
  undefined4 local_c8;
  undefined2 local_c4;
  char local_c2 [122];
  unsigned_long local_48;
  byte *local_40;
  char *local_18;
  undefined4 *local_10;
  
  local_c8 = 0x7461642e;
  local_c4 = 0x2061;
  local_48 = in_RDX;
  local_40 = in_RSI;
  do {
    if (local_48 == 0) {
      return 0;
    }
    local_d8 = 0x10;
    puVar4 = std::min<unsigned_long>(&local_48,&local_d8);
    local_cc = (int)*puVar4;
    local_48 = local_48 - (*puVar4 & 0xffffffff);
    pcVar2 = local_c2;
    do {
      local_e0 = pcVar2;
      bVar1 = *local_40;
      *local_e0 = "0123456789ABCDEF"[bVar1 >> 4];
      local_e0[1] = "0123456789ABCDEF"[bVar1 & 0xf];
      local_40 = local_40 + 1;
      local_cc = local_cc + -1;
      pcVar2 = local_e0 + 2;
    } while (local_cc != 0);
    local_e0[2] = '\n';
    local_10 = &local_c8;
    local_18 = local_e0 + (3 - (long)&local_c8);
    EVar3 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_10,local_18);
  } while (EVar3 == 0);
  return EVar3;
}

Assistant:

Error Logger::logBinary(const void* data, size_t size) noexcept {
  static const char prefix[] = ".data ";
  static const char hex[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };

  const uint8_t* s = static_cast<const uint8_t*>(data);
  size_t i = size;

  char buffer[128];
  ::memcpy(buffer, prefix, ASMJIT_ARRAY_SIZE(prefix) - 1);

  while (i) {
    uint32_t n = static_cast<uint32_t>(std::min<size_t>(i, 16));
    char* p = buffer + ASMJIT_ARRAY_SIZE(prefix) - 1;

    i -= n;
    do {
      uint32_t c = s[0];

      p[0] = hex[c >> 4];
      p[1] = hex[c & 15];

      p += 2;
      s += 1;
    } while (--n);

    *p++ = '\n';
    ASMJIT_PROPAGATE(log(buffer, (size_t)(p - buffer)));
  }

  return kErrorOk;
}